

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthStateMonitor.cpp
# Opt level: O1

void __thiscall PartVolumeButton::paintEvent(PartVolumeButton *this,QPaintEvent *param_1)

{
  long lVar1;
  char cVar2;
  long *plVar3;
  int iVar4;
  QIcon icon;
  QStylePainter painter;
  QStyleOptionFocusRect opt;
  QIcon aQStack_98 [8];
  QPainter local_90 [8];
  PartVolumeButton *local_88;
  long *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  QSize local_60 [10];
  
  QPainter::QPainter(local_90);
  local_88 = this;
  local_80 = (long *)QWidget::style();
  QPainter::begin((QPaintDevice *)local_90);
  plVar3 = (long *)QWidget::style();
  (**(code **)(*plVar3 + 0x100))(aQStack_98,plVar3,0 < this->volume ^ 0x45,0,0);
  lVar1 = *(long *)&this->field_0x20;
  iVar4 = *(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18);
  local_70 = CONCAT44(iVar4,*(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14));
  local_78 = 0;
  local_68 = CONCAT44(iVar4 + 1,(*(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14)) + 1);
  QIcon::pixmap(local_60,(Mode)aQStack_98,(State)&local_68);
  (**(code **)(*local_80 + 0xa0))(local_80,local_90,&local_78,0x84,local_60);
  QPixmap::~QPixmap((QPixmap *)local_60);
  cVar2 = QWidget::hasFocus();
  if (cVar2 != '\0') {
    QStyleOptionFocusRect::QStyleOptionFocusRect((QStyleOptionFocusRect *)local_60);
    QStyleOption::initFrom((QWidget *)local_60);
    (**(code **)(*local_80 + 0xb0))(local_80,3,local_60,local_90,local_88);
    QStyleOption::~QStyleOption((QStyleOption *)local_60);
  }
  QIcon::~QIcon(aQStack_98);
  QPainter::~QPainter(local_90);
  return;
}

Assistant:

void PartVolumeButton::paintEvent(QPaintEvent*) {
	QStylePainter painter(this);
	QIcon icon = style()->standardIcon(volume > 0 ? QStyle::SP_MediaVolume : QStyle::SP_MediaVolumeMuted);
	painter.drawItemPixmap(rect(), Qt::AlignCenter, icon.pixmap(size()));
	if (hasFocus()) {
		QStyleOptionFocusRect opt;
		opt.initFrom(this);
		painter.drawPrimitive(QStyle::PE_FrameFocusRect, opt);
	}
}